

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi-threads-1.cpp
# Opt level: O2

void __thiscall consumer_t::consume(consumer_t *this)

{
  redis_accessor_t *prVar1;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  consumer_t *local_8;
  
  prVar1 = this->redis;
  local_18 = *(undefined4 *)&(prVar1->strand).service_;
  uStack_14 = *(undefined4 *)((long)&(prVar1->strand).service_ + 4);
  uStack_10 = *(undefined4 *)&(prVar1->strand).impl_;
  uStack_c = *(undefined4 *)((long)&(prVar1->strand).impl_ + 4);
  local_8 = this;
  bredis::
  Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  async_read<boost::asio::basic_streambuf<std::allocator<char>>,boost::asio::executor_binder<consumer_t::consume()::_lambda(boost::system::error_code_const&,bredis::positive_parse_result_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>,bredis::parsing_policy::keep_result>&&)_1_,boost::asio::io_context::strand>,bredis::parsing_policy::keep_result>
            ((Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&prVar1->conn,&prVar1->rx_buff,&local_18,1);
  return;
}

Assistant:

void consume(){
        redis.conn.async_read(
            redis.rx_buff,
            asio::bind_executor(redis.strand, [this](const sys::error_code &ec, result_t &&r){
                if(!ec){
                    auto self = this;
                    self->redis.pong_count++;
                    self->redis.rx_buff.consume(r.consumed);
                    self->consume();
                }
            })
        );
    }